

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O2

void __thiscall
PatternParser::parseVariablePattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  int t;
  InputError *pIVar3;
  string *s1;
  double dVar4;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  double local_68;
  double factor;
  undefined1 local_58 [8];
  string timeUnits;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  timeUnits.field_2._8_8_ =
       (ulong)((long)(tokenList->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5;
  if ((int)timeUnits.field_2._8_8_ < 2) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)local_58);
    InputError::InputError(pIVar3,2,&local_108);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  std::__cxx11::string::string((string *)local_58,"VARIABLE",(allocator *)&local_88);
  s1 = pbVar1 + 1;
  bVar2 = Utilities::match(s1,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  if (!bVar2) {
    std::__cxx11::string::string((string *)local_58,"",(allocator *)&local_88);
    factor = (double)(ulong)((uint)timeUnits.field_2._8_8_ & 0x7fffffff);
    for (dVar4 = 4.94065645841247e-324; (ulong)dVar4 < (ulong)factor;
        dVar4 = (double)((long)dVar4 + 2)) {
      t = Utilities::getSeconds(s1,(string *)local_58);
      if (t < 0) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::operator+(&local_88,s1," ");
        std::operator+(&local_e8,&local_88,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        InputError::InputError(pIVar3,7,&local_e8);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      if ((int)timeUnits.field_2._8_4_ <= SUB84(dVar4,0) + 1) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_c8,"",(allocator *)&local_88);
        InputError::InputError(pIVar3,2,&local_c8);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar2 = Utilities::parseNumber<double>(s1 + 1,&local_68);
      if (!bVar2) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_a8,(string *)(s1 + 1));
        InputError::InputError(pIVar3,6,&local_a8);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      VariablePattern::addTime((VariablePattern *)pattern,t);
      Pattern::addFactor(pattern,local_68);
      s1 = s1 + 2;
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void PatternParser::parseVariablePattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  VARIABLE
    //     PatternName  time1  factor1  time2  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to VariablePattern

    VariablePattern* varPat = static_cast<VariablePattern*>(pattern);

    // ... return if second token is the pattern type keyword

    if ( Utilities::match(tokens[1], "VARIABLE") ) return;

    // ... read in pairs of times and pattern factors
    //     (times can be in decimal hours or hours:minutes format)

    string timeUnits("");
    int    seconds;
    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        seconds = Utilities::getSeconds(tokens[i], timeUnits);
        if ( seconds < 0 )
        {
            throw InputError(InputError::INVALID_TIME, tokens[i] + " " + timeUnits);
        }
        i++;
        if ( i >= nTokens ) throw InputError(InputError::TOO_FEW_ITEMS, "");
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        varPat->addTime(seconds);
        varPat->addFactor(factor);
        i++;
    }
}